

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_long_Test::TestBody
          (ByteBufferTest_test_read_write_long_Test *this)

{
  char *pcVar1;
  int64_t long2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  int64_t long1;
  ByteBuffer byte_buffer2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [5];
  ByteBuffer byte_buffer1;
  
  long1 = 0xd15fc7c15;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer1,8);
  bidfx_public_api::tools::ByteBuffer::WriteLong((long)&byte_buffer1);
  gtest_ar_1._0_8_ = bidfx_public_api::tools::ByteBuffer::ReadLong();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&byte_buffer2,"long1","byte_buffer1.ReadLong()",&long1,(long *)&gtest_ar_1)
  ;
  if (byte_buffer2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_68[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_68[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&long2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x8a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&long2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&long2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_68);
  long2 = -0x29da6032d;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer2,8);
  bidfx_public_api::tools::ByteBuffer::WriteLong((long)&byte_buffer2);
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadLong();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"long2","byte_buffer2.ReadLong()",&long2,(long *)&local_98);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x8f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer2);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer1);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_long)
{
    int64_t long1 = 56203443221;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteLong(long1);
    EXPECT_EQ(long1, byte_buffer1.ReadLong());

    int64_t long2 = -11234837293;
    ByteBuffer byte_buffer2(8);
    byte_buffer2.WriteLong(long2);
    EXPECT_EQ(long2, byte_buffer2.ReadLong());
}